

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void correctgraylists(global_State *g)

{
  GCObject **ppGVar1;
  GCObject **list;
  global_State *g_local;
  
  ppGVar1 = correctgraylist(&g->grayagain);
  *ppGVar1 = g->weak;
  g->weak = (GCObject *)0x0;
  ppGVar1 = correctgraylist(ppGVar1);
  *ppGVar1 = g->allweak;
  g->allweak = (GCObject *)0x0;
  ppGVar1 = correctgraylist(ppGVar1);
  *ppGVar1 = g->ephemeron;
  g->ephemeron = (GCObject *)0x0;
  correctgraylist(ppGVar1);
  return;
}

Assistant:

static void correctgraylists (global_State *g) {
  GCObject **list = correctgraylist(&g->grayagain);
  *list = g->weak; g->weak = NULL;
  list = correctgraylist(list);
  *list = g->allweak; g->allweak = NULL;
  list = correctgraylist(list);
  *list = g->ephemeron; g->ephemeron = NULL;
  correctgraylist(list);
}